

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O3

DVector2 P_GetOffsetPosition(double x,double y,double dx,double dy)

{
  line_t_conflict *src;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [8];
  double dVar4;
  double dVar5;
  intercept_t *piVar6;
  FLinePortal *pFVar7;
  double *in_RDI;
  double extraout_XMM0_Qa;
  uint uVar8;
  uint uVar9;
  undefined4 uVar10;
  DVector2 DVar11;
  FLinePortalTraverse it;
  undefined1 local_c8 [8];
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  undefined1 local_88 [16];
  FPathTraverse local_70;
  
  local_b8 = x + dx;
  dStack_b0 = y + dy;
  *in_RDI = local_b8;
  in_RDI[1] = dStack_b0;
  if (PortalBlockmap.containsLines == true) {
    if ((dx < 128.0) && (dy < 128.0)) {
      uVar8 = (uint)((y - bmaporgy) * 0.0078125);
      uVar9 = (uint)((x - bmaporgx) * 0.0078125);
      if (((int)(uVar8 | uVar9) < 0) ||
         (((bmapwidth <= (int)uVar9 || (bmapheight <= (int)uVar8)) ||
          (PortalBlockmap.data.Array[(int)(uVar8 * PortalBlockmap.dx + uVar9)].neighborContainsLines
           != true)))) goto LAB_00474952;
    }
    while( true ) {
      local_70._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_006fef30;
      FPathTraverse::init(&local_70,(EVP_PKEY_CTX *)0x9);
      piVar6 = FPathTraverse::Next(&local_70);
      if (piVar6 == (intercept_t *)0x0) break;
      src = (piVar6->d).line;
      if (src->portalindex < linePortals.Count) {
        pFVar7 = linePortals.Array + src->portalindex;
      }
      else {
        pFVar7 = (FLinePortal *)0x0;
      }
      if ((pFVar7->mFlags & 8) == 0) break;
      dVar1 = piVar6->frac * local_70.trace.dx + local_70.trace.x;
      dVar2 = piVar6->frac * local_70.trace.dy + local_70.trace.y;
      unique0x100000fe = SUB84(dVar2,0);
      local_c8 = (undefined1  [8])dVar1;
      unique0x10000102 = (int)((ulong)dVar2 >> 0x20);
      if (pFVar7->mType == '\x03') {
        dVar4 = (pFVar7->mDisplacement).X;
        dVar5 = (pFVar7->mDisplacement).Y;
        local_b8 = local_b8 + dVar4;
        dStack_b0 = dStack_b0 + dVar5;
        *in_RDI = local_b8;
        in_RDI[1] = dStack_b0;
        auVar3 = (undefined1  [8])(dVar1 + dVar4);
        dVar1 = dVar2 + dVar5;
      }
      else {
        P_TranslatePortalXY(src,(double *)local_c8,(double *)(local_c8 + 8));
        P_TranslatePortalXY(src,in_RDI,in_RDI + 1);
        local_b8 = *in_RDI;
        dStack_b0 = in_RDI[1];
        auVar3 = local_c8;
        dVar1 = dStack_c0;
      }
      uVar10 = (undefined4)((ulong)dVar1 >> 0x20);
      local_88._8_4_ = SUB84(dVar1,0);
      local_88._0_8_ = auVar3;
      local_88._12_4_ = uVar10;
      local_98 = local_b8 - (double)auVar3;
      dStack_90 = dStack_b0 - dVar1;
      local_a8._8_4_ = SUB84(dVar1,0);
      local_a8._0_8_ = dVar1;
      local_a8._12_4_ = uVar10;
      FPathTraverse::~FPathTraverse(&local_70);
      y = (double)local_a8._0_8_;
    }
    FPathTraverse::~FPathTraverse(&local_70);
    x = extraout_XMM0_Qa;
  }
LAB_00474952:
  DVar11.Y = y;
  DVar11.X = x;
  return DVar11;
}

Assistant:

DVector2 P_GetOffsetPosition(double x, double y, double dx, double dy)
{
	DVector2 dest(x + dx, y + dy);
	if (PortalBlockmap.containsLines)
	{
		double actx = x, acty = y;
		// Try some easily discoverable early-out first. If we know that the trace cannot possibly find a portal, this saves us from calling the traverser completely for vast parts of the map.
		if (dx < 128 && dy < 128)
		{
			int blockx = GetBlockX(actx);
			int blocky = GetBlockY(acty);
			if (blockx < 0 || blocky < 0 || blockx >= bmapwidth || blocky >= bmapheight || !PortalBlockmap(blockx, blocky).neighborContainsLines) return dest;
		}

		bool repeat;
		do
		{
			FLinePortalTraverse it;
			it.init(actx, acty, dx, dy, PT_ADDLINES|PT_DELTA);
			intercept_t *in;

			repeat = false;
			while ((in = it.Next()))
			{
				// hit a portal line.
				line_t *line = in->d.line;
				FLinePortal *port = line->getPortal();

				// Teleport portals are intentionally ignored since skipping this stuff is their entire reason for existence.
				if (port->mFlags & PORTF_INTERACTIVE)
				{
					DVector2 hit = it.InterceptPoint(in);

					if (port->mType == PORTT_LINKED)
					{
						// optimized handling for linked portals where we only need to add an offset.
						hit += port->mDisplacement;
						dest += port->mDisplacement;
					}
					else
					{
						// interactive ones are more complex because the vector may be rotated.
						// Note: There is no z-translation here, there's just too much code in the engine that wouldn't be able to handle interactive portals with a height difference.
						P_TranslatePortalXY(line, hit.X, hit.Y);
						P_TranslatePortalXY(line, dest.X, dest.Y);
					}
					// update the fields, end this trace and restart from the new position
					dx = dest.X - hit.X;
					dy = dest.Y - hit.Y;
					actx = hit.X;
					acty = hit.Y;
					repeat = true;
				}

				break;
			}
		} while (repeat);
	}
	return dest;
}